

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int flags,char *pText,int nText,
                      char *pLoc,int nLoc,_func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  long in_FS_OFFSET;
  void *local_28;
  _func_int_void_ptr_int_char_ptr_int_int_int *local_20;
  Fts5Tokenizer *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = xToken;
  local_18 = pTokenizer + 0x28;
  local_28 = pCtx;
  iVar1 = (**(code **)(pTokenizer + 0x18))(*(undefined8 *)(pTokenizer + 0x20),&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5PorterTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int flags,
  const char *pText, int nText,
  const char *pLoc, int nLoc,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  PorterTokenizer *p = (PorterTokenizer*)pTokenizer;
  PorterContext sCtx;
  sCtx.xToken = xToken;
  sCtx.pCtx = pCtx;
  sCtx.aBuf = p->aBuf;
  return p->tokenizer_v2.xTokenize(
      p->pTokenizer, (void*)&sCtx, flags, pText, nText, pLoc, nLoc, fts5PorterCb
  );
}